

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::EndGroup(void)

{
  ImGuiItemStatusFlags *pIVar1;
  ImVec2 *lhs;
  float fVar2;
  char cVar3;
  int iVar4;
  ImGuiID IVar5;
  ImGuiWindow *pIVar6;
  ImGuiGroupData *pIVar7;
  ImVec2 IVar8;
  bool bVar9;
  ImGuiContext *pIVar10;
  bool bVar11;
  char cVar12;
  ImGuiID IVar13;
  bool bVar14;
  uint uVar15;
  ImVec2 IVar16;
  ImVec2 IVar17;
  ImRect group_bb;
  float local_48;
  float fStack_44;
  ImVec2 local_30;
  
  pIVar10 = GImGui;
  pIVar6 = GImGui->CurrentWindow;
  iVar4 = (GImGui->GroupStack).Size;
  pIVar7 = (GImGui->GroupStack).Data;
  if ((pIVar6->DC).IsSetPos == true) {
    ErrorCheckUsingSetCursorPosToExtendParentBoundaries();
  }
  lhs = &(pIVar6->DC).CursorMaxPos;
  IVar16 = ImMax(lhs,&pIVar7[(long)iVar4 + -1].BackupCursorPos);
  IVar8 = pIVar7[(long)iVar4 + -1].BackupCursorPos;
  (pIVar6->DC).CursorPos = IVar8;
  group_bb.Min = IVar8;
  group_bb.Max = IVar16;
  IVar17 = ImMax(&pIVar7[(long)iVar4 + -1].BackupCursorMaxPos,lhs);
  (pIVar6->DC).CursorMaxPos = IVar17;
  (pIVar6->DC).Indent.x = pIVar7[(long)iVar4 + -1].BackupIndent.x;
  (pIVar6->DC).GroupOffset.x = pIVar7[(long)iVar4 + -1].BackupGroupOffset.x;
  (pIVar6->DC).CurrLineSize = pIVar7[(long)iVar4 + -1].BackupCurrLineSize;
  (pIVar6->DC).CurrLineTextBaseOffset = pIVar7[(long)iVar4 + -1].BackupCurrLineTextBaseOffset;
  if (pIVar10->LogEnabled == true) {
    pIVar10->LogLinePosY = -3.4028235e+38;
  }
  if (pIVar7[(long)iVar4 + -1].EmitItem != true) goto LAB_001cc274;
  fVar2 = (pIVar6->DC).PrevLineTextBaseOffset;
  uVar15 = -(uint)(pIVar7[(long)iVar4 + -1].BackupCurrLineTextBaseOffset <= fVar2);
  (pIVar6->DC).CurrLineTextBaseOffset =
       (float)(~uVar15 & (uint)pIVar7[(long)iVar4 + -1].BackupCurrLineTextBaseOffset |
              (uint)fVar2 & uVar15);
  local_48 = IVar16.x;
  fStack_44 = IVar16.y;
  local_30.y = fStack_44 - IVar8.y;
  local_30.x = local_48 - IVar8.x;
  ItemSize(&local_30,-1.0);
  ItemAdd(&group_bb,0,(ImRect *)0x0,1);
  IVar5 = pIVar10->ActiveId;
  if (pIVar7[(long)iVar4 + -1].BackupActiveIdIsAlive == IVar5) {
    if (pIVar7[(long)iVar4 + -1].BackupActiveIdPreviousFrameIsAlive == false) {
      cVar3 = pIVar10->ActiveIdPreviousFrameIsAlive;
joined_r0x001cc209:
      if (cVar3 != '\0') {
        IVar13 = pIVar10->ActiveIdPreviousFrame;
        cVar3 = '\x01';
        bVar11 = false;
        goto LAB_001cc1fc;
      }
    }
    bVar9 = false;
    cVar12 = '\0';
  }
  else {
    bVar14 = pIVar10->ActiveIdIsAlive != IVar5;
    IVar13 = IVar5;
    if (pIVar7[(long)iVar4 + -1].BackupActiveIdPreviousFrameIsAlive == false) {
      cVar3 = pIVar10->ActiveIdPreviousFrameIsAlive;
      bVar11 = true;
      if (IVar5 == 0 || bVar14) goto joined_r0x001cc209;
    }
    else {
      cVar12 = '\0';
      bVar9 = false;
      cVar3 = '\0';
      bVar11 = true;
      if (IVar5 == 0 || bVar14) goto LAB_001cc20f;
    }
LAB_001cc1fc:
    bVar9 = bVar11;
    cVar12 = cVar3;
    (pIVar10->LastItemData).ID = IVar13;
  }
LAB_001cc20f:
  (pIVar10->LastItemData).Rect.Min = group_bb.Min;
  (pIVar10->LastItemData).Rect.Max = group_bb.Max;
  if ((pIVar7[(long)iVar4 + -1].BackupHoveredIdIsAlive == false) && (pIVar10->HoveredId != 0)) {
    pIVar1 = &(pIVar10->LastItemData).StatusFlags;
    *(byte *)pIVar1 = (byte)*pIVar1 | 0x80;
  }
  if ((bVar9) && (pIVar10->ActiveIdHasBeenEditedThisFrame == true)) {
    pIVar1 = &(pIVar10->LastItemData).StatusFlags;
    *(byte *)pIVar1 = (byte)*pIVar1 | 4;
  }
  uVar15 = (pIVar10->LastItemData).StatusFlags;
  (pIVar10->LastItemData).StatusFlags = uVar15 | 0x20;
  if ((cVar12 != '\0') && (IVar5 != pIVar10->ActiveIdPreviousFrame)) {
    (pIVar10->LastItemData).StatusFlags = uVar15 | 0x60;
  }
LAB_001cc274:
  (pIVar10->GroupStack).Size = (pIVar10->GroupStack).Size + -1;
  return;
}

Assistant:

void ImGui::EndGroup()
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;
    IM_ASSERT(g.GroupStack.Size > 0); // Mismatched BeginGroup()/EndGroup() calls

    ImGuiGroupData& group_data = g.GroupStack.back();
    IM_ASSERT(group_data.WindowID == window->ID); // EndGroup() in wrong window?

    if (window->DC.IsSetPos)
        ErrorCheckUsingSetCursorPosToExtendParentBoundaries();

    ImRect group_bb(group_data.BackupCursorPos, ImMax(window->DC.CursorMaxPos, group_data.BackupCursorPos));

    window->DC.CursorPos = group_data.BackupCursorPos;
    window->DC.CursorMaxPos = ImMax(group_data.BackupCursorMaxPos, window->DC.CursorMaxPos);
    window->DC.Indent = group_data.BackupIndent;
    window->DC.GroupOffset = group_data.BackupGroupOffset;
    window->DC.CurrLineSize = group_data.BackupCurrLineSize;
    window->DC.CurrLineTextBaseOffset = group_data.BackupCurrLineTextBaseOffset;
    if (g.LogEnabled)
        g.LogLinePosY = -FLT_MAX; // To enforce a carriage return

    if (!group_data.EmitItem)
    {
        g.GroupStack.pop_back();
        return;
    }

    window->DC.CurrLineTextBaseOffset = ImMax(window->DC.PrevLineTextBaseOffset, group_data.BackupCurrLineTextBaseOffset);      // FIXME: Incorrect, we should grab the base offset from the *first line* of the group but it is hard to obtain now.
    ItemSize(group_bb.GetSize());
    ItemAdd(group_bb, 0, NULL, ImGuiItemFlags_NoTabStop);

    // If the current ActiveId was declared within the boundary of our group, we copy it to LastItemId so IsItemActive(), IsItemDeactivated() etc. will be functional on the entire group.
    // It would be neater if we replaced window.DC.LastItemId by e.g. 'bool LastItemIsActive', but would put a little more burden on individual widgets.
    // Also if you grep for LastItemId you'll notice it is only used in that context.
    // (The two tests not the same because ActiveIdIsAlive is an ID itself, in order to be able to handle ActiveId being overwritten during the frame.)
    const bool group_contains_curr_active_id = (group_data.BackupActiveIdIsAlive != g.ActiveId) && (g.ActiveIdIsAlive == g.ActiveId) && g.ActiveId;
    const bool group_contains_prev_active_id = (group_data.BackupActiveIdPreviousFrameIsAlive == false) && (g.ActiveIdPreviousFrameIsAlive == true);
    if (group_contains_curr_active_id)
        g.LastItemData.ID = g.ActiveId;
    else if (group_contains_prev_active_id)
        g.LastItemData.ID = g.ActiveIdPreviousFrame;
    g.LastItemData.Rect = group_bb;

    // Forward Hovered flag
    const bool group_contains_curr_hovered_id = (group_data.BackupHoveredIdIsAlive == false) && g.HoveredId != 0;
    if (group_contains_curr_hovered_id)
        g.LastItemData.StatusFlags |= ImGuiItemStatusFlags_HoveredWindow;

    // Forward Edited flag
    if (group_contains_curr_active_id && g.ActiveIdHasBeenEditedThisFrame)
        g.LastItemData.StatusFlags |= ImGuiItemStatusFlags_Edited;

    // Forward Deactivated flag
    g.LastItemData.StatusFlags |= ImGuiItemStatusFlags_HasDeactivated;
    if (group_contains_prev_active_id && g.ActiveId != g.ActiveIdPreviousFrame)
        g.LastItemData.StatusFlags |= ImGuiItemStatusFlags_Deactivated;

    g.GroupStack.pop_back();
    //window->DrawList->AddRect(group_bb.Min, group_bb.Max, IM_COL32(255,0,255,255));   // [Debug]
}